

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exereader.cpp
# Opt level: O2

resource loader::anon_unknown_0::ne_reader::find_resource(istream *is,uint32_t name,uint32_t type)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  ulong uVar5;
  short sVar6;
  ulong local_40;
  
  std::istream::seekg((long)is,0x22);
  uVar1 = util::load<short,util::little_endian>(is);
  uVar2 = util::load<short,util::little_endian>(is);
  local_40 = 0;
  if (uVar2 != uVar1) {
    uVar5 = 0;
    if ((*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) != 0)
    goto LAB_0012e2dd;
    std::istream::seekg((long)is,uVar1 - 0x28);
    uVar1 = util::load<short,util::little_endian>(is);
    local_40 = 0;
    if (uVar1 < 0x20) {
      uVar5 = 0;
      if ((*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) != 0)
      goto LAB_0012e2dd;
      while( true ) {
        local_40 = 0;
        uVar2 = util::load<short,util::little_endian>(is);
        uVar3 = util::load<short,util::little_endian>(is);
        std::istream::seekg((long)is,4);
        if (uVar2 == 0) break;
        uVar5 = 0;
        if ((*(uint *)(&is->field_0x20 + (long)is->_vptr_basic_istream[-3]) & 5) != 0)
        goto LAB_0012e2dd;
        if ((type & 0xffff | 0x8000) == (uint)uVar2) {
          local_40._0_4_ = name & 0xffff | 0x8000;
          sVar6 = uVar3 + 1;
          goto LAB_0012e25e;
        }
        std::istream::seekg((long)is,(uint)uVar3 * 0xc);
      }
    }
  }
LAB_0012e2db:
  local_40 = 0;
  uVar5 = 0;
  goto LAB_0012e2dd;
  while( true ) {
    uVar2 = util::load<short,util::little_endian>(is);
    uVar3 = util::load<short,util::little_endian>(is);
    std::istream::seekg((long)is,_S_end);
    uVar4 = util::load<short,util::little_endian>(is);
    std::istream::seekg((long)is,4);
    if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) != 0) goto LAB_0012e2db;
    if ((uint)local_40 == uVar4) break;
LAB_0012e25e:
    sVar6 = sVar6 + -1;
    if (sVar6 == 0) goto LAB_0012e2db;
  }
  local_40 = (ulong)((uint)uVar2 << ((byte)uVar1 & 0x1f));
  uVar5 = (ulong)((uint)uVar3 << ((byte)uVar1 & 0x1f)) << 0x20;
LAB_0012e2dd:
  return (resource)(local_40 | uVar5);
}

Assistant:

exe_reader::resource ne_reader::find_resource(std::istream & is, boost::uint32_t name,
                                              boost::uint32_t type) {
	
	resource result;
	result.offset = result.size = 0;
	
	is.seekg(0x24 - 2, std::ios_base::cur); // Already read the magic
	boost::uint16_t resources_offset = util::load<boost::uint16_t>(is);
	boost::uint16_t resources_end = util::load<boost::uint16_t>(is);
	if(is.fail()) {
		return result;
	}
	
	if(resources_end == resources_offset) {
		return result;
	}
	
	is.seekg(std::streamoff(resources_offset) - 0x28, std::ios_base::cur);
	
	boost::uint16_t shift = util::load<boost::uint16_t>(is);
	if(is.fail() || shift >= 32) {
		return result;
	}
	
	boost::uint16_t name_count;
	for(;;) {
		
		boost::uint16_t type_id = util::load<boost::uint16_t>(is);
		name_count = util::load<boost::uint16_t>(is);
		is.seekg(4, std::ios_base::cur);
		if(is.fail() || type_id == 0) {
			return result;
		}
		
		if(type_id == boost::uint16_t(type | 0x8000)) {
			break;
		}
		
		is.seekg(name_count * 12, std::ios_base::cur);
		
	}
	
	for(boost::uint16_t i = 0; i < name_count; i++) {
		
		boost::uint16_t offset = util::load<boost::uint16_t>(is);
		boost::uint16_t size   = util::load<boost::uint16_t>(is);
		is.seekg(2, std::ios_base::cur);
		boost::uint16_t name_id = util::load<boost::uint16_t>(is);
		is.seekg(4, std::ios_base::cur);
		if(is.fail()) {
			return result;
		}
		
		if(name_id == boost::uint16_t(name | 0x8000)) {
			result.offset = boost::uint32_t(offset) << shift;
			result.size   = boost::uint32_t(size)   << shift;
			break;
		}
		
	}
	
	return result;
}